

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O0

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::QControlledGate2<std::complex<float>_>::matrix
          (QControlledGate2<std::complex<float>_> *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  complex<float> in_RCX;
  complex<float> m01;
  complex<float> m01_00;
  data_type extraout_RDX;
  QControlledGate2<std::complex<float>_> *in_RSI;
  complex<float> m00;
  complex<float> in_R8;
  SquareMatrix<std::complex<float>_> SVar3;
  SquareMatrix<std::complex<float>_> local_130;
  SquareMatrix<std::complex<float>_> local_120;
  SquareMatrix<std::complex<float>_> local_110;
  SquareMatrix<std::complex<float>_> local_100;
  SquareMatrix<std::complex<float>_> local_f0;
  SquareMatrix<std::complex<float>_> local_e0;
  undefined4 local_cc;
  SquareMatrix<std::complex<float>_> local_c8;
  SquareMatrix<std::complex<float>_> local_b8;
  undefined1 local_a8 [8];
  matrix_type CG;
  complex<float> local_90;
  complex<float> local_88;
  complex<float> local_80;
  undefined1 local_78 [8];
  matrix_type E1;
  complex<float> local_5c;
  complex<float> local_54 [2];
  complex<float> local_40;
  undefined1 local_38 [8];
  matrix_type E0;
  matrix_type I2;
  QControlledGate2<std::complex<float>_> *this_local;
  
  m00._M_value = 2;
  dense::eye<std::complex<float>>((dense *)&E0.data_,2);
  std::complex<float>::complex(&local_40,1.0,0.0);
  std::complex<float>::complex(local_54,0.0,0.0);
  std::complex<float>::complex(&local_5c,0.0,0.0);
  std::complex<float>::complex
            ((complex<float> *)
             ((long)&E1.data_._M_t.
                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                     .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 4),0.0,0.0)
  ;
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_38,m00,m01,in_RCX,in_R8);
  std::complex<float>::complex(&local_80,0.0,0.0);
  std::complex<float>::complex(&local_88,0.0,0.0);
  std::complex<float>::complex(&local_90,0.0,0.0);
  std::complex<float>::complex((complex<float> *)&CG.data_,1.0,0.0);
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_78,m00,m01_00,in_RCX,in_R8);
  iVar1 = (*(in_RSI->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[0x10])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))(local_a8);
  if (in_RSI->controlState_ == 0) {
    iVar1 = control(in_RSI);
    iVar2 = (*(in_RSI->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
              _vptr_QObject[0xf])();
    if (iVar1 < iVar2) {
      dense::kron<std::complex<float>>
                ((dense *)&local_b8,(SquareMatrix<std::complex<float>_> *)local_38,
                 (SquareMatrix<std::complex<float>_> *)local_a8);
      dense::kron<std::complex<float>>
                ((dense *)&local_c8,(SquareMatrix<std::complex<float>_> *)local_78,
                 (SquareMatrix<std::complex<float>_> *)&E0.data_);
      dense::operator+((dense *)this,&local_b8,&local_c8);
      dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_c8);
      dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_b8);
    }
    else {
      dense::kron<std::complex<float>>
                ((dense *)&local_e0,(SquareMatrix<std::complex<float>_> *)local_a8,
                 (SquareMatrix<std::complex<float>_> *)local_38);
      dense::kron<std::complex<float>>
                ((dense *)&local_f0,(SquareMatrix<std::complex<float>_> *)&E0.data_,
                 (SquareMatrix<std::complex<float>_> *)local_78);
      dense::operator+((dense *)this,&local_e0,&local_f0);
      dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_f0);
      dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_e0);
    }
  }
  else {
    iVar1 = control(in_RSI);
    iVar2 = (*(in_RSI->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
              _vptr_QObject[0xf])();
    if (iVar1 < iVar2) {
      dense::kron<std::complex<float>>
                ((dense *)&local_100,(SquareMatrix<std::complex<float>_> *)local_38,
                 (SquareMatrix<std::complex<float>_> *)&E0.data_);
      dense::kron<std::complex<float>>
                ((dense *)&local_110,(SquareMatrix<std::complex<float>_> *)local_78,
                 (SquareMatrix<std::complex<float>_> *)local_a8);
      dense::operator+((dense *)this,&local_100,&local_110);
      dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_110);
      dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_100);
    }
    else {
      dense::kron<std::complex<float>>
                ((dense *)&local_120,(SquareMatrix<std::complex<float>_> *)&E0.data_,
                 (SquareMatrix<std::complex<float>_> *)local_38);
      dense::kron<std::complex<float>>
                ((dense *)&local_130,(SquareMatrix<std::complex<float>_> *)local_a8,
                 (SquareMatrix<std::complex<float>_> *)local_78);
      dense::operator+((dense *)this,&local_120,&local_130);
      dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_130);
      dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_120);
    }
  }
  local_cc = 1;
  dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_a8);
  dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_78);
  dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_38);
  dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&E0.data_);
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using matrix_type = qclab::dense::SquareMatrix< T > ;
          const matrix_type  I2 = qclab::dense::eye< T >( 2 ) ;
          const matrix_type  E0( 1 , 0 ,
                                 0 , 0 ) ;
          const matrix_type  E1( 0 , 0 ,
                                 0 , 1 ) ;
          const matrix_type  CG = this->gate()->matrix() ;
          if ( controlState_ == 0 ) {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , CG ) +
                     qclab::dense::kron( E1 , I2 ) ;
            } else {
              return qclab::dense::kron( CG , E0 ) +
                     qclab::dense::kron( I2 , E1 ) ;
            }
          } else {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , I2 ) +
                     qclab::dense::kron( E1 , CG ) ;
            } else {
              return qclab::dense::kron( I2 , E0 ) +
                     qclab::dense::kron( CG , E1 ) ;
            }
          }
        }